

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_ems_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((type != ssl_client_hello_inner) && (hs->min_version < 0x304)) {
    iVar1 = CBB_add_u16(out,0x17);
    if (iVar1 == 0) {
      bVar2 = false;
    }
    else {
      iVar1 = CBB_add_u16(out,0);
      bVar2 = iVar1 != 0;
    }
  }
  return bVar2;
}

Assistant:

static bool ext_ems_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                    CBB *out_compressible,
                                    ssl_client_hello_type_t type) {
  // Extended master secret is not necessary in TLS 1.3.
  if (hs->min_version >= TLS1_3_VERSION || type == ssl_client_hello_inner) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_extended_master_secret) ||
      !CBB_add_u16(out, 0 /* length */)) {
    return false;
  }

  return true;
}